

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

void __thiscall
Saturation::ConsequenceFinder::indexClause
          (ConsequenceFinder *this,uint indexNum,Clause *cl,bool add)

{
  SkipList<Kernel::Clause_*,_Lib::Int> **ppSVar1;
  SkipList<Kernel::Clause_*,_Lib::Int> *this_00;
  undefined3 in_register_00000009;
  ZIArray<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *this_01;
  ulong n;
  
  this_01 = &this->_index;
  n = (ulong)indexNum;
  ppSVar1 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                      (&this_01->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,n);
  if (CONCAT31(in_register_00000009,add) != 0) {
    if (*ppSVar1 == (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0) {
      this_00 = (SkipList<Kernel::Clause_*,_Lib::Int> *)
                Lib::SkipList<Kernel::Clause*,Lib::Int>::operator_new(0x10);
      Lib::SkipList<Kernel::Clause_*,_Lib::Int>::SkipList(this_00);
      ppSVar1 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                          (&this_01->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,n);
      *ppSVar1 = this_00;
    }
    ppSVar1 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                        (&this_01->super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,n);
    Lib::SkipList<Kernel::Clause_*,_Lib::Int>::insert(*ppSVar1,cl);
    return;
  }
  Lib::SkipList<Kernel::Clause*,Lib::Int>::remove<Kernel::Clause*>
            ((SkipList<Kernel::Clause*,Lib::Int> *)*ppSVar1,cl);
  return;
}

Assistant:

void ConsequenceFinder::indexClause(unsigned indexNum, Clause* cl, bool add)
{
  if(add) {
    if(!_index[indexNum]) {
      _index[indexNum]=new ClauseSL();
    }
    _index[indexNum]->insert(cl);
  }
  else {
    ASS(_index[indexNum]);
    _index[indexNum]->remove(cl);
  }
}